

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  parasail_result_t *ppVar7;
  __m256i *ptr;
  int32_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  __m256i *palVar13;
  uint uVar14;
  __m256i *palVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong size;
  undefined8 uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  __m256i alVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_scan_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar1 = (profile->profile32).score;
    if (pvVar1 == (void *)0x0) {
      parasail_nw_scan_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_nw_scan_profile_avx2_256_32_cold_6();
      }
      else {
        uVar14 = profile->s1Len;
        if ((int)uVar14 < 1) {
          parasail_nw_scan_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_scan_profile_avx2_256_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_scan_profile_avx2_256_32_cold_3();
        }
        else if (open < 0) {
          parasail_nw_scan_profile_avx2_256_32_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_scan_profile_avx2_256_32_cold_1();
        }
        else {
          uVar9 = uVar14 - 1;
          size = (ulong)uVar14 + 7 >> 3;
          iVar11 = -open;
          iVar6 = ppVar2->min;
          uVar14 = 0x80000000 - iVar6;
          if (iVar6 != iVar11 && SBORROW4(iVar6,iVar11) == iVar6 + open < 0) {
            uVar14 = open | 0x80000000;
          }
          iVar6 = 0x7ffffffe - ppVar2->max;
          ppVar7 = parasail_result_new();
          if (ppVar7 != (parasail_result_t *)0x0) {
            iVar10 = (int)(uVar9 / size);
            ppVar7->flag = ppVar7->flag | 0x8400401;
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign_int32_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int32_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar8 = s2Len + -1;
              auVar22._4_4_ = open;
              auVar22._0_4_ = open;
              auVar22._8_4_ = open;
              auVar22._12_4_ = open;
              auVar22._16_4_ = open;
              auVar22._20_4_ = open;
              auVar22._24_4_ = open;
              auVar22._28_4_ = open;
              auVar24._4_4_ = gap;
              auVar24._0_4_ = gap;
              auVar24._8_4_ = gap;
              auVar24._12_4_ = gap;
              auVar24._16_4_ = gap;
              auVar24._20_4_ = gap;
              auVar24._24_4_ = gap;
              auVar24._28_4_ = gap;
              iVar18 = uVar14 + 1;
              auVar20._4_4_ = iVar18;
              auVar20._0_4_ = iVar18;
              auVar20._8_4_ = iVar18;
              auVar20._12_4_ = iVar18;
              auVar20._16_4_ = iVar18;
              auVar20._20_4_ = iVar18;
              auVar20._24_4_ = iVar18;
              auVar20._28_4_ = iVar18;
              auVar21._4_4_ = iVar6;
              auVar21._0_4_ = iVar6;
              auVar21._8_4_ = iVar6;
              auVar21._12_4_ = iVar6;
              auVar21._16_4_ = iVar6;
              auVar21._20_4_ = iVar6;
              auVar21._24_4_ = iVar6;
              auVar21._28_4_ = iVar6;
              iVar6 = -(gap * (int)size);
              auVar26._4_4_ = iVar6;
              auVar26._0_4_ = iVar6;
              auVar26._8_4_ = iVar6;
              auVar26._12_4_ = iVar6;
              auVar26._16_4_ = iVar6;
              auVar26._20_4_ = iVar6;
              auVar26._24_4_ = iVar6;
              auVar26._28_4_ = iVar6;
              auVar26 = vpblendd_avx2(auVar26,SUB6432(ZEXT1664((undefined1  [16])0x0),0),1);
              auVar25 = ZEXT1232(CONCAT84(SUB128(ZEXT812(0),4),iVar18));
              auVar26 = vpaddd_avx2(auVar25,auVar26);
              auVar31._4_4_ = 0;
              auVar31._0_4_ = open;
              auVar27._4_4_ = iVar11;
              auVar27._0_4_ = iVar11;
              auVar27._8_4_ = iVar11;
              auVar27._12_4_ = iVar11;
              auVar27._16_4_ = iVar11;
              auVar27._20_4_ = iVar11;
              auVar27._24_4_ = iVar11;
              auVar27._28_4_ = iVar11;
              auVar30._8_8_ = size;
              auVar30._0_8_ = size;
              auVar30._16_8_ = size;
              auVar30._24_8_ = size;
              auVar4 = vpmuldq_avx2(auVar30,_DAT_00908c60);
              auVar5 = vpmuldq_avx2(auVar30,_DAT_00908b60);
              auVar31._8_4_ = open;
              auVar31._12_4_ = 0;
              auVar31._16_4_ = open;
              auVar31._20_4_ = 0;
              auVar31._24_4_ = open;
              auVar31._28_4_ = 0;
              uVar12 = 0;
              auVar30 = vpmovsxbd_avx2(ZEXT816(0x706060406040200));
              auVar33._8_8_ = 0xffffffff80000000;
              auVar33._0_8_ = 0xffffffff80000000;
              auVar33._16_8_ = 0xffffffff80000000;
              auVar33._24_8_ = 0xffffffff80000000;
              palVar13 = ptr_02;
              palVar15 = ptr;
              do {
                auVar38._8_8_ = uVar12;
                auVar38._0_8_ = uVar12;
                auVar38._16_8_ = uVar12;
                auVar38._24_8_ = uVar12;
                auVar32 = vpaddq_avx2(auVar38,auVar4);
                auVar38 = vpaddq_avx2(auVar5,auVar38);
                auVar38 = vpermd_avx2(auVar30,auVar38);
                auVar32 = vpermd_avx2(auVar30,auVar32);
                auVar35._0_16_ = ZEXT116(0) * auVar32._0_16_ + ZEXT116(1) * auVar38._0_16_;
                auVar35._16_16_ = ZEXT116(0) * auVar38._16_16_ + ZEXT116(1) * auVar32._0_16_;
                auVar32 = vpmulld_avx2(auVar24,auVar35);
                alVar23 = (__m256i)vpsubd_avx2(auVar27,auVar32);
                auVar32 = vpmovsxdq_avx2(alVar23._16_16_);
                auVar38 = vpmovsxdq_avx2(alVar23._0_16_);
                auVar35 = vpsubq_avx2(auVar32,auVar31);
                auVar32 = vpcmpgtq_avx2(auVar35,auVar33);
                auVar32 = vblendvpd_avx(auVar33,auVar35,auVar32);
                auVar35 = vpsubq_avx2(auVar38,auVar31);
                auVar38 = vpcmpgtq_avx2(auVar35,auVar33);
                auVar38 = vblendvpd_avx(auVar33,auVar35,auVar38);
                auVar38 = vpermd_avx2(auVar30,auVar38);
                auVar32 = vpermd_avx2(auVar30,auVar32);
                *palVar13 = alVar23;
                *(undefined1 (*) [16])(*palVar15 + 2) = auVar32._0_16_;
                *(undefined1 (*) [16])*palVar15 = auVar38._0_16_;
                uVar12 = uVar12 + 1;
                palVar15 = palVar15 + 1;
                palVar13 = palVar13 + 1;
              } while (size != uVar12);
              *ptr_00 = 0;
              lVar17 = (ulong)(uint)s2Len - 1;
              auVar34._8_8_ = lVar17;
              auVar34._0_8_ = lVar17;
              auVar34._16_8_ = lVar17;
              auVar34._24_8_ = lVar17;
              auVar30 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar12 = 0;
              auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar31 = vpmovsxbq_avx2(ZEXT416(0x7060504));
              auVar32._8_8_ = 0x8000000000000000;
              auVar32._0_8_ = 0x8000000000000000;
              auVar32._16_8_ = 0x8000000000000000;
              auVar32._24_8_ = 0x8000000000000000;
              auVar4 = vpcmpeqd_avx2((undefined1  [32])alVar23,(undefined1  [32])alVar23);
              auVar36._8_4_ = 8;
              auVar36._0_8_ = 0x800000008;
              auVar36._12_4_ = 8;
              auVar36._16_4_ = 8;
              auVar36._20_4_ = 8;
              auVar36._24_4_ = 8;
              auVar36._28_4_ = 8;
              do {
                auVar37._8_8_ = uVar12;
                auVar37._0_8_ = uVar12;
                auVar37._16_8_ = uVar12;
                auVar37._24_8_ = uVar12;
                auVar38 = vpor_avx2(auVar37,auVar5);
                auVar33 = vpor_avx2(auVar37,auVar31);
                auVar33 = vpcmpgtq_avx2(auVar33 ^ auVar32,auVar34 ^ auVar32);
                auVar38 = vpcmpgtq_avx2(auVar38 ^ auVar32,auVar34 ^ auVar32);
                auVar33 = vpackssdw_avx2(auVar38,auVar33);
                auVar3 = vpackssdw_avx(SUB3216(auVar33 ^ auVar4,0),SUB3216(auVar33 ^ auVar4,0x10));
                auVar3 = vpshufd_avx(auVar3,0xd8);
                auVar33 = vpmovzxwd_avx2(auVar3);
                auVar38 = vpslld_avx2(auVar33,0x1f);
                auVar33 = vpaddd_avx2(auVar4,auVar30);
                auVar33 = vpmulld_avx2(auVar33,auVar24);
                auVar33 = vpsubd_avx2(auVar27,auVar33);
                auVar33 = vpmaskmovd_avx2(auVar38,auVar33);
                *(undefined1 (*) [32])(ptr_00 + uVar12 + 1) = auVar33;
                uVar12 = uVar12 + 8;
                auVar30 = vpaddd_avx2(auVar36,auVar30);
              } while ((s2Len + 7U & 0xfffffff8) != uVar12);
              alVar23 = (__m256i)vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar22);
              uVar14 = (int)size - 1;
              palVar13 = ptr_03 + uVar14;
              uVar12 = size;
              do {
                *palVar13 = alVar23;
                alVar23 = (__m256i)vpsubd_avx2((undefined1  [32])alVar23,auVar24);
                palVar13 = palVar13 + -1;
                iVar6 = (int)uVar12;
                uVar16 = iVar6 - 1;
                uVar12 = (ulong)uVar16;
              } while (uVar16 != 0 && 0 < iVar6);
              uVar12 = 0;
              auVar30 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
              auVar28 = ZEXT3264(auVar20);
              auVar29 = ZEXT3264(auVar21);
              do {
                auVar4 = vpermd_avx2(auVar30,(undefined1  [32])ptr_02[uVar14]);
                auVar4 = vpblendd_avx2(auVar4,ZEXT432((uint)ptr_00[uVar12]),1);
                iVar6 = ppVar2->mapper[(byte)s2[uVar12]];
                auVar27 = vpsubd_avx2(auVar20,(undefined1  [32])*ptr_03);
                lVar17 = 0;
                auVar5 = auVar20;
                do {
                  auVar31 = vpaddd_avx2(auVar4,*(undefined1 (*) [32])
                                                ((long)pvVar1 + lVar17 + (long)iVar6 * size * 0x20))
                  ;
                  auVar4 = *(undefined1 (*) [32])((long)*ptr_02 + lVar17);
                  auVar33 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr + lVar17),auVar24);
                  auVar32 = vpsubd_avx2(auVar4,auVar22);
                  auVar33 = vpmaxsd_avx2(auVar33,auVar32);
                  auVar27 = vpaddd_avx2(auVar27,*(undefined1 (*) [32])((long)*ptr_03 + lVar17));
                  auVar5 = vpmaxsd_avx2(auVar5,auVar27);
                  auVar27 = vpmaxsd_avx2(auVar33,auVar31);
                  *(undefined1 (*) [32])((long)*ptr + lVar17) = auVar33;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar17) = auVar27;
                  lVar17 = lVar17 + 0x20;
                } while (size * 0x20 != lVar17);
                auVar4 = vpermd_avx2(auVar30,auVar27);
                lVar17 = uVar12 + 1;
                uVar12 = uVar12 + 1;
                auVar27 = vpblendd_avx2(auVar4,ZEXT432((uint)ptr_00[lVar17]),1);
                auVar4 = vpaddd_avx2(auVar27,(undefined1  [32])*ptr_03);
                auVar4 = vpmaxsd_avx2(auVar5,auVar4);
                iVar6 = 6;
                do {
                  auVar5 = vperm2i128_avx2(auVar4,auVar4,0x28);
                  auVar5 = vpalignr_avx2(auVar4,auVar5,0xc);
                  auVar5 = vpaddd_avx2(auVar5,auVar26);
                  auVar4 = vpmaxsd_avx2(auVar4,auVar5);
                  iVar6 = iVar6 + -1;
                } while (iVar6 != 0);
                auVar5 = vperm2i128_avx2(auVar4,auVar4,0x28);
                auVar4 = vpalignr_avx2(auVar4,auVar5,0xc);
                auVar4 = vpaddd_avx2(auVar4,auVar25);
                auVar5 = vpmaxsd_avx2(auVar27,auVar4);
                lVar17 = 0;
                do {
                  auVar4 = vpsubd_avx2(auVar4,auVar24);
                  auVar5 = vpsubd_avx2(auVar5,auVar22);
                  auVar4 = vpmaxsd_avx2(auVar4,auVar5);
                  auVar5 = vpmaxsd_avx2(auVar4,*(undefined1 (*) [32])((long)*ptr_01 + lVar17));
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar17) = auVar5;
                  auVar31 = vpminsd_avx2(auVar29._0_32_,auVar5);
                  auVar29 = ZEXT3264(auVar31);
                  auVar27 = vpmaxsd_avx2(auVar28._0_32_,auVar5);
                  auVar28 = ZEXT3264(auVar27);
                  lVar17 = lVar17 + 0x20;
                } while (size * 0x20 != lVar17);
              } while (uVar12 != (uint)s2Len);
              alVar23 = ptr_02[(ulong)uVar9 % size];
              if (iVar10 < 7) {
                iVar6 = 0;
                do {
                  auVar26 = vperm2i128_avx2((undefined1  [32])alVar23,(undefined1  [32])alVar23,0x28
                                           );
                  alVar23 = (__m256i)vpalignr_avx2((undefined1  [32])alVar23,auVar26,0xc);
                  iVar6 = iVar6 + 1;
                } while (iVar6 < 7 - iVar10);
              }
              auVar26 = vpcmpgtd_avx2(auVar20,auVar31);
              auVar30 = vpcmpgtd_avx2(auVar27,auVar21);
              auVar26 = vpor_avx2(auVar30,auVar26);
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0x7f,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0xbf,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar26[0x1f]) {
                auVar26 = vpermq_avx2((undefined1  [32])alVar23,0xff);
                auVar3 = vpshufd_avx(auVar26._0_16_,0x55);
                auVar3 = vpinsrd_avx(auVar3,uVar9,1);
                uVar19 = auVar3._0_8_;
              }
              else {
                *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
                uVar19 = 0;
                iVar8 = 0;
              }
              ppVar7->score = (int)uVar19;
              ppVar7->end_query = (int)((ulong)uVar19 >> 0x20);
              ppVar7->end_ref = iVar8;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar7;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vE, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vHp = _mm256_add_epi32(vHp, vW);
            vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[i]));
            vHt = _mm256_max_epi32(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHt = _mm256_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            vF = _mm256_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        vH = _mm256_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vF, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vH = _mm256_max_epi32(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}